

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

vec2F __thiscall
crnlib::dxt_hc::palettize_alpha
          (dxt_hc *this,color_quad_u8 *pixels,uint pixels_count,uint comp_index)

{
  vec2F vVar1;
  bool bVar2;
  byte *pbVar3;
  float *pfVar4;
  float in_ECX;
  long in_RDX;
  long in_RSI;
  vec<2U,_float> *in_RDI;
  uint in_R8D;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  vec1F result [2];
  uint i;
  uint size;
  uint weights [64];
  vec1F vectors [64];
  uint p;
  uint8 alpha [64];
  float *this_00;
  vec<1U,_float> *x;
  uchar *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  float fVar5;
  vec<1U,_float> *local_2a8;
  vec<2U,_float> local_288;
  vec<1U,_float> local_280;
  uint local_27c;
  int local_278 [64];
  vec<1U,_float> local_178 [64];
  vec<1U,_float> avStack_78 [3];
  float local_6c;
  byte local_68 [72];
  uint local_20;
  float local_1c [1];
  long local_18;
  
  local_20 = in_R8D;
  local_1c[0] = in_ECX;
  local_18 = in_RDX;
  for (local_6c = 0.0; (uint)local_6c < (uint)local_1c[0]; local_6c = (float)((int)local_6c + 1)) {
    pbVar3 = color_quad<unsigned_char,_int>::operator[]
                       ((color_quad<unsigned_char,_int> *)(local_18 + (ulong)(uint)local_6c * 4),
                        local_20);
    local_68[(uint)local_6c] = *pbVar3;
  }
  std::sort<unsigned_char*>
            ((uchar *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
             in_stack_fffffffffffffd38);
  local_2a8 = local_178;
  do {
    vec<1U,_float>::vec(local_2a8);
    local_2a8 = local_2a8 + 1;
  } while (local_2a8 != avStack_78);
  local_27c = 0;
  for (local_280.m_s[0] = (float  [1])0.0; (uint)local_280.m_s[0] < (uint)local_1c[0];
      local_280.m_s[0] = (float  [1])((int)local_280.m_s[0] + 1)) {
    if ((local_280.m_s[0] == 0.0) ||
       (local_68[(uint)local_280.m_s[0]] != local_68[(int)local_280.m_s[0] - 1])) {
      fVar5 = *(float *)(in_RSI + 0x234 + (ulong)local_68[(uint)local_280.m_s[0]] * 4);
      pfVar4 = vec<1U,_float>::operator[](local_178 + local_27c,0);
      *pfVar4 = fVar5;
      local_278[local_27c] = 1;
      local_27c = local_27c + 1;
    }
    else {
      local_278[local_27c - 1] = local_278[local_27c - 1] + 1;
    }
  }
  x = &local_280;
  pfVar4 = local_288.m_s;
  do {
    this_00 = pfVar4;
    vec<1U,_float>::vec((vec<1U,_float> *)this_00);
    pfVar4 = this_00 + 1;
  } while ((vec<1U,_float> *)(this_00 + 1) != x);
  split_vectors<crnlib::vec<1u,float>>
            ((vec<1U,_float> (*) [64])alpha._48_8_,(uint (*) [64])alpha._40_8_,alpha._36_4_,
             (vec<1U,_float> (*) [2])alpha._24_8_);
  bVar2 = helpers::operator>(x,(vec<1U,_float> *)this_00);
  if (bVar2) {
    utils::swap<crnlib::vec<1u,float>>(x,(vec<1U,_float> *)this_00);
  }
  vec<2U,_float>::vec(in_RDI,&local_288);
  vVar1.m_s[1] = extraout_XMM0_Db;
  vVar1.m_s[0] = extraout_XMM0_Da;
  return (vec2F)vVar1.m_s;
}

Assistant:

vec2F dxt_hc::palettize_alpha(color_quad_u8* pixels, uint pixels_count, uint comp_index) {
  uint8 alpha[64];
  for (uint p = 0; p < pixels_count; p++)
    alpha[p] = pixels[p][comp_index];
  std::sort(alpha, alpha + pixels_count);
  vec1F vectors[64];
  uint weights[64];
  uint size = 0;
  for (uint i = 0; i < pixels_count; i++) {
    if (!i || alpha[i] != alpha[i - 1]) {
      vectors[size][0] = m_uint8_to_float[alpha[i]];
      weights[size] = 1;
      size++;
    } else {
      weights[size - 1]++;
    }
  }
  vec1F result[2];
  split_vectors<vec1F>(vectors, weights, size, result);
  if (result[0] > result[1])
    utils::swap(result[0], result[1]);
  return *(vec2F*)result;
}